

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swipe.cc
# Opt level: O2

void sptk::swipe::Snth(matrix S,vector x,vector pc,vector fERBs,vector d,intvector ws,intvector ps,
                      double nyquist,double nyquist2,double dt,int n)

{
  vector pci;
  vector mu;
  int w2;
  int lo;
  int iVar1;
  long lVar2;
  double *pdVar3;
  double **extraout_RDX_00;
  double *extraout_RDX_01;
  double *extraout_RDX_02;
  long lVar5;
  int xSz;
  vector fERBs_00;
  matrix L;
  vector vVar6;
  vector vVar7;
  vector yr_vector;
  vector yr_vector_00;
  matrix yr_matrix;
  vector yr_vector_01;
  vector yr_vector_02;
  undefined4 uStack_4c;
  undefined4 uStack_3c;
  double *extraout_RDX;
  double *pdVar4;
  
  w2 = ws.v[n] / 2;
  vVar7._4_4_ = 0;
  vVar7.x = fERBs.x;
  vVar6._4_4_ = 0;
  vVar6.x = x.x;
  vVar6.v = x.v;
  vVar7.v = fERBs.v;
  L = loudness(vVar6,vVar7,nyquist,ws.v[n],w2);
  yr_vector.v = L.m;
  yr_vector._0_8_ = d.v;
  lo = bisectv((swipe *)(ulong)(uint)d.x,yr_vector,(double)n);
  yr_vector_00.v = extraout_RDX;
  yr_vector_00._0_8_ = d.v;
  iVar1 = bisectv((swipe *)(ulong)(uint)d.x,yr_vector_00,(double)(n + 2));
  xSz = iVar1 - lo;
  vVar6 = makev(xSz);
  pdVar3 = vVar6.v;
  vVar7 = makev(xSz);
  pdVar4 = vVar7.v;
  lVar2 = (long)lo;
  for (lVar5 = 0; lVar2 + lVar5 < (long)iVar1; lVar5 = lVar5 + 1) {
    pdVar4[lVar5] = pc.v[lVar2 + lVar5];
    pdVar3[lVar5] = 1.0 - ABS(d.v[lVar2 + lVar5] - (double)(n + 1));
  }
  mu._4_4_ = uStack_4c;
  mu.x = vVar6.x;
  pci._4_4_ = uStack_3c;
  pci.x = vVar7.x;
  fERBs_00._4_4_ = 0;
  fERBs_00.x = fERBs.x;
  pci.v = pdVar4;
  mu.v = pdVar3;
  fERBs_00.v = fERBs.v;
  Sadd(S,L,fERBs_00,pci,mu,ps,dt,nyquist2,lo,xSz,w2);
  yr_matrix.m = extraout_RDX_00;
  yr_matrix._0_8_ = yr_vector.v;
  freem(L._0_8_,yr_matrix);
  yr_vector_01.v = extraout_RDX_01;
  yr_vector_01._0_8_ = pdVar3;
  freev((swipe *)(ulong)(uint)vVar6.x,yr_vector_01);
  yr_vector_02.v = extraout_RDX_02;
  yr_vector_02._0_8_ = pdVar4;
  freev((swipe *)(ulong)(uint)vVar7.x,yr_vector_02);
  return;
}

Assistant:

void Snth(matrix S, vector x, vector pc, vector fERBs, vector d,
                              intvector ws, intvector ps, double nyquist, 
                              double nyquist2, double dt, int n) {
    int i;
    int w2 = ws.v[n] / 2;
    matrix L = loudness(x, fERBs, nyquist, ws.v[n], w2);
    int lo = bisectv(d, n); // start of Snth-specific code
    int hi = bisectv(d, n + 2);
    int psz = hi - lo;
    vector mu = makev(psz);
    vector pci = makev(psz);
    int ti = 0;
    for (i = lo; i < hi; i++) {
        pci.v[ti] = pc.v[i];
        mu.v[ti] = 1. - fabs(d.v[i] - (n + 1));
        ti++;
    } // end of Snth-specific code
    Sadd(S, L, fERBs, pci, mu, ps, dt, nyquist2, lo, psz, w2); 
    freem(L);
    freev(mu);
    freev(pci); 
}